

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_delay.c
# Opt level: O0

t_int * sigdelread_perform(t_int *w)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  t_sample *ptVar6;
  undefined1 *puVar7;
  t_sample *ep;
  t_sample *bp;
  t_sample *vp;
  int nsamps;
  int phase;
  int n;
  int delsamps;
  t_delwritectl *c;
  t_sample *out;
  t_int *w_local;
  
  piVar3 = (int *)w[2];
  vp._4_4_ = piVar3[4] - *(int *)w[3];
  iVar1 = *piVar3;
  lVar4 = *(long *)(piVar3 + 2);
  iVar2 = *piVar3;
  if (vp._4_4_ < 0) {
    vp._4_4_ = iVar1 + vp._4_4_;
  }
  ep = (t_sample *)(lVar4 + (long)vp._4_4_ * 4);
  nsamps = (int)w[4];
  c = (t_delwritectl *)w[1];
  while (iVar5 = nsamps + -1, nsamps != 0) {
    ptVar6 = ep + 1;
    puVar7 = &c->field_0x4;
    c->c_n = (int)*ep;
    ep = ptVar6;
    nsamps = iVar5;
    c = (t_delwritectl *)puVar7;
    if (ptVar6 == (t_sample *)(lVar4 + (long)(iVar2 + 4) * 4)) {
      ep = ptVar6 + -(long)iVar1;
    }
  }
  return w + 5;
}

Assistant:

static t_int *sigdelread_perform(t_int *w)
{
    t_sample *out = (t_sample *)(w[1]);
    t_delwritectl *c = (t_delwritectl *)(w[2]);
    int delsamps = *(int *)(w[3]);
    int n = (int)(w[4]);
    int phase = c->c_phase - delsamps, nsamps = c->c_n;
    t_sample *vp = c->c_vec, *bp, *ep = vp + (c->c_n + XTRASAMPS);
    if (phase < 0) phase += nsamps;
    bp = vp + phase;

    while (n--)
    {
        *out++ = *bp++;
        if (bp == ep) bp -= nsamps;
    }
    return (w+5);
}